

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O2

bool __thiscall
AsymmetricAlgorithm::wrapKey
          (AsymmetricAlgorithm *this,PublicKey *publicKey,ByteString *data,ByteString *encryptedData
          ,Type padding)

{
  int iVar1;
  
  if ((padding < RSA_SHA1_PKCS) && ((0x1aU >> (padding & (GOST|RSA_SHA256_PKCS)) & 1) != 0)) {
    iVar1 = (*this->_vptr_AsymmetricAlgorithm[10])();
    return SUB41(iVar1,0);
  }
  return false;
}

Assistant:

bool AsymmetricAlgorithm::isWrappingMech(AsymMech::Type padding)
{
	switch (padding)
	{
		case AsymMech::RSA:
		case AsymMech::RSA_PKCS:
		case AsymMech::RSA_PKCS_OAEP:
			return true;

		default:
			return false;
	}
}